

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void __thiscall FWeaponSlot::AddWeaponList(FWeaponSlot *this,char *list,bool clear)

{
  char *__s;
  char *local_48;
  char *tok;
  char *buff;
  FString copy;
  bool clear_local;
  char *list_local;
  FWeaponSlot *this_local;
  
  copy.Chars._7_1_ = clear;
  FString::FString((FString *)&buff,list);
  __s = FString::LockBuffer((FString *)&buff);
  if ((copy.Chars._7_1_ & 1) != 0) {
    Clear(this);
  }
  local_48 = strtok(__s," ");
  while (local_48 != (char *)0x0) {
    AddWeapon(this,local_48);
    local_48 = strtok((char *)0x0," ");
  }
  FString::~FString((FString *)&buff);
  return;
}

Assistant:

void FWeaponSlot :: AddWeaponList(const char *list, bool clear)
{
	FString copy(list);
	char *buff = copy.LockBuffer();
	char *tok;

	if (clear)
	{
		Clear();
	}
	tok = strtok(buff, " ");
	while (tok != NULL)
	{
		AddWeapon(tok);
		tok = strtok(NULL, " ");
	}
}